

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_short,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar6 = *(uint *)&this->num_components_;
  bVar5 = out_num_components;
  if ((byte)uVar6 < out_num_components) {
    bVar5 = (byte)uVar6;
  }
  if (bVar5 != 0) {
    puVar2 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = this->normalized_;
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (puVar3 <= puVar2 + lVar7 + uVar4) {
        return false;
      }
      fVar10 = (float)*(ushort *)(puVar2 + uVar8 * 2 + uVar4);
      fVar9 = fVar10 / 65535.0;
      if ((bVar1 & 1U) == 0) {
        fVar9 = fVar10;
      }
      out_value[uVar8] = fVar9;
      uVar8 = uVar8 + 1;
      uVar6 = *(uint *)&this->num_components_;
      bVar5 = (byte)uVar6;
      if (out_num_components <= (byte)uVar6) {
        bVar5 = out_num_components;
      }
      lVar7 = lVar7 + 2;
    } while (uVar8 < bVar5);
  }
  if ((byte)uVar6 < out_num_components) {
    memset(out_value + (uVar6 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar6 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }